

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O2

int GetInfoRequestRPLIDAR
              (RPLIDAR *pRPLIDAR,int *pModelID,int *pHardwareVersion,int *pFirmwareMajor,
              int *pFirmwareMinor,char *SerialNumber)

{
  int iVar1;
  char *__s;
  long lVar2;
  int DataType;
  int DataResponseLength;
  int SendMode;
  uchar reqbuf [2];
  uchar databuf [20];
  
  DataResponseLength = 0;
  reqbuf[0] = 0xa5;
  reqbuf[1] = 'P';
  SendMode = 0;
  DataType = 0;
  iVar1 = WriteAllRS232Port(&pRPLIDAR->RS232Port,reqbuf,2);
  if (iVar1 == 0) {
    iVar1 = GetResponseDescriptorRPLIDAR(pRPLIDAR,&DataResponseLength,&SendMode,&DataType);
    if (iVar1 != 0) {
      return 1;
    }
    __s = "A RPLIDAR is not responding correctly : Bad response descriptor. ";
    if ((DataResponseLength == 0x14) && (DataType == 4)) {
      databuf[0] = '\0';
      databuf[1] = '\0';
      databuf[2] = '\0';
      databuf[3] = '\0';
      databuf[4] = '\0';
      databuf[5] = '\0';
      databuf[6] = '\0';
      databuf[7] = '\0';
      databuf[8] = '\0';
      databuf[9] = '\0';
      databuf[10] = '\0';
      databuf[0xb] = '\0';
      databuf[0xc] = '\0';
      databuf[0xd] = '\0';
      databuf[0xe] = '\0';
      databuf[0xf] = '\0';
      databuf[0x10] = '\0';
      databuf[0x11] = '\0';
      databuf[0x12] = '\0';
      databuf[0x13] = '\0';
      iVar1 = ReadAllRS232Port(&pRPLIDAR->RS232Port,databuf,0x14);
      if (iVar1 == 0) {
        *pModelID = (uint)databuf[0];
        *pFirmwareMinor = (uint)databuf[1];
        *pFirmwareMajor = (uint)databuf[2];
        *pHardwareVersion = (uint)databuf[3];
        SerialNumber[0x10] = '\0';
        SerialNumber[0x11] = '\0';
        SerialNumber[0x12] = '\0';
        SerialNumber[0x13] = '\0';
        SerialNumber[0x14] = '\0';
        SerialNumber[0x15] = '\0';
        SerialNumber[0x16] = '\0';
        SerialNumber[0x17] = '\0';
        SerialNumber[0x18] = '\0';
        SerialNumber[0x19] = '\0';
        SerialNumber[0x1a] = '\0';
        SerialNumber[0x1b] = '\0';
        SerialNumber[0x1c] = '\0';
        SerialNumber[0x1d] = '\0';
        SerialNumber[0x1e] = '\0';
        SerialNumber[0x1f] = '\0';
        SerialNumber[0] = '\0';
        SerialNumber[1] = '\0';
        SerialNumber[2] = '\0';
        SerialNumber[3] = '\0';
        SerialNumber[4] = '\0';
        SerialNumber[5] = '\0';
        SerialNumber[6] = '\0';
        SerialNumber[7] = '\0';
        SerialNumber[8] = '\0';
        SerialNumber[9] = '\0';
        SerialNumber[10] = '\0';
        SerialNumber[0xb] = '\0';
        SerialNumber[0xc] = '\0';
        SerialNumber[0xd] = '\0';
        SerialNumber[0xe] = '\0';
        SerialNumber[0xf] = '\0';
        SerialNumber[0x20] = '\0';
        for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
          sprintf(SerialNumber,"%02X",(ulong)databuf[lVar2 + 4]);
          SerialNumber = SerialNumber + 2;
        }
        return 0;
      }
      __s = "A RPLIDAR is not responding correctly. ";
    }
  }
  else {
    __s = "Error writing data to a RPLIDAR. ";
  }
  puts(__s);
  return 1;
}

Assistant:

inline int GetInfoRequestRPLIDAR(RPLIDAR* pRPLIDAR, int* pModelID, int* pHardwareVersion, int* pFirmwareMajor, int* pFirmwareMinor, char* SerialNumber)
{
	int i = 0;

#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
    sl_lidar_response_device_info_t devinfo;

	if (SL_IS_FAIL(pRPLIDAR->drv->getDeviceInfo(devinfo)))
	{
		printf("A RPLIDAR is not responding correctly : getDeviceInfo() failed. \n");
		return EXIT_FAILURE;
	}

	// Analyze the data response.
	*pModelID = devinfo.model;
	*pFirmwareMinor = (devinfo.firmware_version & 0x00FF);
	*pFirmwareMajor = (devinfo.firmware_version >> 8);
	*pHardwareVersion = devinfo.hardware_version;

	// 128bit unique serial number, when converting to text in hex, the Least Significant Byte prints first.
	memset(SerialNumber, 0, MAX_BUF_LEN_SERIAL_NUMBER_RPLIDAR);
	for (i = 0; i < NB_BYTES_SERIAL_NUMBER_RPLIDAR; i++)
	{
		sprintf(SerialNumber+2*i, "%02X", (int)(unsigned char)devinfo.serialnum[i]);
	}
#else
	unsigned char reqbuf[] = {START_FLAG1_RPLIDAR,GET_INFO_REQUEST_RPLIDAR};
	unsigned char databuf[20];
	int DataResponseLength = 0, SendMode = 0, DataType = 0;

	// Send request.
	if (WriteAllRS232Port(&pRPLIDAR->RS232Port, reqbuf, sizeof(reqbuf)) != EXIT_SUCCESS)
	{
		printf("Error writing data to a RPLIDAR. \n");
		return EXIT_FAILURE;
	}

	// Receive the response descriptor.
	if (GetResponseDescriptorRPLIDAR(pRPLIDAR, &DataResponseLength, &SendMode, &DataType) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	// Quick check of the response descriptor.
	if ((DataResponseLength != 20)||(DataType != DEVINFO_RESPONSE_RPLIDAR))
	{ 
		printf("A RPLIDAR is not responding correctly : Bad response descriptor. \n");
		return EXIT_FAILURE;	
	}

	// Receive the data response.
	memset(databuf, 0, sizeof(databuf));
	if (ReadAllRS232Port(&pRPLIDAR->RS232Port, databuf, sizeof(databuf)) != EXIT_SUCCESS)
	{ 
		printf("A RPLIDAR is not responding correctly. \n");
		return EXIT_FAILURE;	
	}

	// Analyze the data response.
	*pModelID = databuf[0];
	*pFirmwareMinor = databuf[1];
	*pFirmwareMajor = databuf[2];
	*pHardwareVersion = databuf[3];

	// 128bit unique serial number, when converting to text in hex, the Least Significant Byte prints first.
	memset(SerialNumber, 0, MAX_BUF_LEN_SERIAL_NUMBER_RPLIDAR);
	for (i = 0; i < NB_BYTES_SERIAL_NUMBER_RPLIDAR; i++)
	{
		sprintf(SerialNumber+2*i, "%02X", (int)(unsigned char)databuf[i+4]);
	}
#endif // ENABLE_RPLIDAR_SDK_SUPPORT

	return EXIT_SUCCESS;
}